

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cc
# Opt level: O3

void __thiscall OverlaySpace::restoreXml(OverlaySpace *this,Element *el)

{
  string *__rhs;
  uint4 *puVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint *puVar4;
  uint4 uVar5;
  pointer pcVar6;
  int4 iVar7;
  string *psVar8;
  AddrSpace *pAVar9;
  LowlevelError *this_00;
  uint uVar10;
  uint4 uVar11;
  string basename;
  istringstream s1;
  string local_1f0;
  string local_1d0;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"name","");
  Element::getAttributeValue(el,local_1b0);
  __rhs = &(this->super_AddrSpace).name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  paVar3 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"index","");
  psVar8 = Element::getAttributeValue(el,&local_1f0);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  puVar4 = (uint *)((long)&local_1b0[0].field_2 +
                   *(long *)(local_1b0[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar4 = *puVar4 & 0xffffffb5;
  std::istream::operator>>(local_1b0,&(this->super_AddrSpace).index);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"base","");
  psVar8 = Element::getAttributeValue(el,&local_1d0);
  pcVar6 = (psVar8->_M_dataplus)._M_p;
  local_1f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar6,pcVar6 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  pAVar9 = AddrSpaceManager::getSpaceByName((this->super_AddrSpace).manage,&local_1f0);
  this->baseSpace = pAVar9;
  if (pAVar9 != (AddrSpace *)0x0) {
    uVar5 = pAVar9->addressSize;
    (this->super_AddrSpace).addressSize = uVar5;
    uVar10 = pAVar9->wordsize;
    (this->super_AddrSpace).wordsize = uVar10;
    iVar7 = pAVar9->deadcodedelay;
    (this->super_AddrSpace).delay = pAVar9->delay;
    (this->super_AddrSpace).deadcodedelay = iVar7;
    uVar11 = 8;
    if ((int)uVar5 < 8) {
      uVar11 = uVar5;
    }
    (this->super_AddrSpace).highest = (ulong)(uVar10 - 1) + (ulong)uVar10 * uintbmasks[(int)uVar11];
    uVar10 = pAVar9->flags;
    if ((uVar10 & 1) != 0) {
      puVar1 = &(this->super_AddrSpace).flags;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
      uVar10 = pAVar9->flags;
    }
    if ((uVar10 >> 8 & 1) != 0) {
      pbVar2 = (byte *)((long)&(this->super_AddrSpace).flags + 1);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_1d0,"Base space does not exist for overlay space: ",__rhs);
  LowlevelError::LowlevelError(this_00,&local_1d0);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void OverlaySpace::restoreXml(const Element *el)

{
  name = el->getAttributeValue("name");
  istringstream s1(el->getAttributeValue("index"));
  s1.unsetf(ios::dec | ios::hex | ios::oct);
  s1 >> index;
  
  string basename = el->getAttributeValue("base");
  baseSpace = getManager()->getSpaceByName(basename);
  if (baseSpace == (AddrSpace *)0)
    throw LowlevelError("Base space does not exist for overlay space: "+name);
  addressSize = baseSpace->getAddrSize();
  wordsize = baseSpace->getWordSize();
  delay = baseSpace->getDelay();
  deadcodedelay = baseSpace->getDeadcodeDelay();
  calcScaleMask();

  if (baseSpace->isBigEndian())
    setFlags(big_endian);
  if (baseSpace->hasPhysical())
    setFlags(hasphysical);
}